

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O0

int LoadCkeyEkeySize(TCascStorage *param_1,char *param_2,char *szDataPtr,char *szDataEnd,
                    void *pvParam)

{
  DWORD local_44;
  void *pvStack_40;
  DWORD ContentSize;
  PCASC_CKEY_ENTRY pCKeyEntry;
  void *pvParam_local;
  char *szDataEnd_local;
  char *szDataPtr_local;
  char *param_1_local;
  TCascStorage *param_0_local;
  
  local_44 = 0;
  pvStack_40 = pvParam;
  pCKeyEntry = (PCASC_CKEY_ENTRY)pvParam;
  pvParam_local = szDataEnd;
  szDataEnd_local = szDataPtr;
  szDataPtr_local = param_2;
  param_1_local = (char *)param_1;
  szDataEnd_local = CaptureDecimalInteger(szDataPtr,szDataEnd,&local_44);
  if (szDataEnd_local == (char *)0x0) {
    param_0_local._4_4_ = 1000;
  }
  else {
    ConvertIntegerToBytes_4(local_44,(LPBYTE)((long)pvStack_40 + 2));
    param_0_local._4_4_ = 0;
  }
  return param_0_local._4_4_;
}

Assistant:

static int LoadCkeyEkeySize(TCascStorage * /* hs */, const char * /* szVariableName */, const char * szDataPtr, const char * szDataEnd, void * pvParam)
{
    PCASC_CKEY_ENTRY pCKeyEntry = (PCASC_CKEY_ENTRY)pvParam;
    DWORD ContentSize = 0;

    // Load the content size. The encoded size is ignored for now
    szDataPtr = CaptureDecimalInteger(szDataPtr, szDataEnd, &ContentSize);
    if(szDataPtr == NULL)
        return ERROR_BAD_FORMAT;

    // Convert the content size into the big-endian
    ConvertIntegerToBytes_4(ContentSize, pCKeyEntry->ContentSize);
    return ERROR_SUCCESS;
}